

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::AdamOptimizer::SharedDtor(AdamOptimizer *this)

{
  if (this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    if (this->learningrate_ != (DoubleParameter *)0x0) {
      (*(this->learningrate_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->minibatchsize_ != (Int64Parameter *)0x0) {
      (*(this->minibatchsize_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->beta1_ != (DoubleParameter *)0x0) {
      (*(this->beta1_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->beta2_ != (DoubleParameter *)0x0) {
      (*(this->beta2_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->eps_ != (DoubleParameter *)0x0) {
      (*(this->eps_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void AdamOptimizer::SharedDtor() {
  if (this != internal_default_instance()) {
    delete learningrate_;
  }
  if (this != internal_default_instance()) {
    delete minibatchsize_;
  }
  if (this != internal_default_instance()) {
    delete beta1_;
  }
  if (this != internal_default_instance()) {
    delete beta2_;
  }
  if (this != internal_default_instance()) {
    delete eps_;
  }
}